

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

size_t fd_boot_image_size(int media_type)

{
  char *pcStack_10;
  int media_type_local;
  
  if (media_type == 1) {
    pcStack_10 = (char *)0x12c000;
  }
  else if (media_type == 2) {
    pcStack_10 = (char *)0x168000;
  }
  else if (media_type == 3) {
    pcStack_10 = "eratorTarget20ModuleDefinitionInfoEEEED2Ev";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return (size_t)pcStack_10;
}

Assistant:

static size_t
fd_boot_image_size(int media_type)
{
	switch (media_type) {
	case BOOT_MEDIA_1_2M_DISKETTE:
		return (FD_1_2M_SIZE);
	case BOOT_MEDIA_1_44M_DISKETTE:
		return (FD_1_44M_SIZE);
	case BOOT_MEDIA_2_88M_DISKETTE:
		return (FD_2_88M_SIZE);
	default:
		return (0);
	}
}